

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::SetDOMWrapperTracingCallback
          (Recycler *this,void *state,DOMWrapperTracingCallback tracingCallback,
          DOMWrapperTracingDoneCallback tracingDoneCallback,
          DOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback_local;
  DOMWrapperTracingDoneCallback tracingDoneCallback_local;
  DOMWrapperTracingCallback tracingCallback_local;
  void *state_local;
  Recycler *this_local;
  
  if (state == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x232e,"(state)","state");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (tracingCallback == (DOMWrapperTracingCallback)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x232f,"(tracingCallback)","tracingCallback");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (enterFinalPauseCallback == (DOMWrapperTracingEnterFinalPauseCallback)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2330,"(enterFinalPauseCallback)","enterFinalPauseCallback");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  RecyclerCollectionWrapper::SetWrapperTracingCallbackState(this->collectionWrapper,state);
  RecyclerCollectionWrapper::SetDOMWrapperTracingCallback(this->collectionWrapper,tracingCallback);
  RecyclerCollectionWrapper::SetDOMWrapperTracingDoneCallback
            (this->collectionWrapper,tracingDoneCallback);
  RecyclerCollectionWrapper::SetDOMWrapperTracingEnterFinalPauseCallback
            (this->collectionWrapper,enterFinalPauseCallback);
  return;
}

Assistant:

void Recycler::SetDOMWrapperTracingCallback(void * state, DOMWrapperTracingCallback tracingCallback, DOMWrapperTracingDoneCallback tracingDoneCallback, DOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)
{
    Assert(state);
    Assert(tracingCallback);
    Assert(enterFinalPauseCallback);
    this->collectionWrapper->SetWrapperTracingCallbackState(state);
    this->collectionWrapper->SetDOMWrapperTracingCallback(tracingCallback);
    this->collectionWrapper->SetDOMWrapperTracingDoneCallback(tracingDoneCallback);
    this->collectionWrapper->SetDOMWrapperTracingEnterFinalPauseCallback(enterFinalPauseCallback);
}